

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NetworkBrokerData.cpp
# Opt level: O0

shared_ptr<helics::helicsCLI11App> __thiscall
helics::NetworkBrokerData::commandLineParser
          (NetworkBrokerData *this,string_view localAddress,bool enableConfig)

{
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values_00;
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values_01;
  element_type *peVar1;
  OptionDefaults *pOVar2;
  Option *pOVar3;
  string *option_description;
  string *flag_name;
  string *flag_description;
  undefined8 in_RCX;
  undefined8 in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  element_type *in_RDI;
  byte in_R8B;
  shared_ptr<helics::helicsCLI11App> sVar4;
  Option_group *encrypt_group;
  Option *interfaceFlag;
  HelicsConfigJSON *fmtr;
  shared_ptr<helics::helicsCLI11App> *nbparser;
  Validator *in_stack_ffffffffffffe988;
  Option *in_stack_ffffffffffffe990;
  anon_class_24_2_3e6758c4 *in_stack_ffffffffffffe998;
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *in_stack_ffffffffffffe9a0;
  Validator *in_stack_ffffffffffffe9a8;
  Option *in_stack_ffffffffffffe9b0;
  char (*in_stack_ffffffffffffe9b8) [94];
  allocator<char> *in_stack_ffffffffffffe9c0;
  char *in_stack_ffffffffffffe9c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe9d0;
  function<void_()> *in_stack_ffffffffffffe9d8;
  helicsCLI11App *in_stack_ffffffffffffe9e0;
  Validator *in_stack_ffffffffffffe9e8;
  Option *in_stack_ffffffffffffe9f0;
  undefined7 in_stack_ffffffffffffe9f8;
  undefined1 in_stack_ffffffffffffe9ff;
  Option *in_stack_ffffffffffffea00;
  string *in_stack_ffffffffffffea50;
  string *in_stack_ffffffffffffea58;
  App *in_stack_ffffffffffffea60;
  allocator<char> *flag_result;
  string *in_stack_ffffffffffffea68;
  App *in_stack_ffffffffffffea70;
  App *this_00;
  string *in_stack_ffffffffffffea78;
  function<void_(long)> *in_stack_ffffffffffffea80;
  string *in_stack_ffffffffffffea88;
  App *in_stack_ffffffffffffea90;
  string *in_stack_ffffffffffffea98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffeaa0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *variable;
  string *in_stack_ffffffffffffeaa8;
  App *in_stack_ffffffffffffeab0;
  App *this_01;
  string *in_stack_ffffffffffffeab8;
  App *in_stack_ffffffffffffeac0;
  undefined8 ***pppuVar5;
  undefined1 ***local_1538;
  App *in_stack_ffffffffffffeb80;
  undefined1 ***local_1458;
  undefined1 ***local_11e8;
  allocator<char> local_1109 [40];
  allocator<char> local_10e1 [40];
  allocator<char> local_10b9 [40];
  allocator<char> local_1091 [40];
  allocator<char> local_1069 [40];
  undefined1 local_1041 [80];
  allocator<char> local_ff1 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_fc1;
  undefined1 local_f99 [80];
  allocator<char> local_f49 [41];
  undefined1 **local_f20 [8];
  undefined1 local_ee0 [64];
  undefined8 **local_ea0 [28];
  allocator<char> local_db9 [80];
  allocator<char> local_d69 [40];
  allocator<char> local_d41 [40];
  allocator<char> local_d19 [40];
  allocator<char> local_cf1 [40];
  allocator<char> local_cc9 [40];
  allocator<char> local_ca1 [40];
  allocator<char> local_c79 [40];
  allocator<char> local_c51 [40];
  allocator<char> local_c29 [40];
  allocator<char> local_c01 [40];
  allocator<char> local_bd9 [33];
  undefined8 **local_bb8;
  undefined1 **local_bb0 [8];
  undefined8 **local_b70;
  undefined8 local_b68;
  allocator<char> local_a89 [40];
  allocator<char> local_a61 [40];
  allocator<char> local_a39 [80];
  allocator<char> local_9e9 [40];
  allocator<char> local_9c1 [80];
  allocator<char> local_971 [40];
  allocator<char> local_949 [40];
  allocator<char> local_921 [40];
  allocator<char> local_8f9 [40];
  allocator<char> local_8d1 [40];
  allocator<char> local_8a9 [40];
  allocator<char> local_881 [40];
  allocator<char> local_859 [40];
  allocator<char> local_831 [40];
  allocator<char> local_809 [40];
  allocator<char> local_7e1 [40];
  allocator<char> local_7b9 [40];
  allocator<char> local_791 [144];
  allocator<char> local_701 [40];
  allocator<char> local_6d9 [40];
  allocator<char> local_6b1 [144];
  allocator<char> local_621 [40];
  allocator<char> local_5f9 [40];
  allocator<char> local_5d1 [40];
  allocator<char> local_5a9 [40];
  allocator<char> local_581 [41];
  undefined8 local_558;
  undefined8 uStack_550;
  allocator<char> local_521 [40];
  allocator<char> local_4f9 [40];
  allocator<char> local_4d1 [40];
  allocator<char> local_4a9 [40];
  allocator<char> local_481 [40];
  allocator<char> local_459 [40];
  allocator<char> local_431 [40];
  allocator<char> local_409 [40];
  allocator<char> local_3e1 [41];
  undefined8 local_3b8;
  undefined8 uStack_3b0;
  allocator<char> local_381 [40];
  allocator<char> local_359 [33];
  undefined8 **local_338;
  undefined1 **local_330 [8];
  undefined1 local_2f0 [64];
  undefined1 local_2b0 [64];
  undefined1 local_270 [64];
  undefined1 local_230 [64];
  undefined8 **local_1f0;
  undefined8 local_1e8;
  allocator<char> local_109 [40];
  allocator<char> local_e1 [40];
  allocator<char> local_b9 [40];
  allocator<char> local_91 [33];
  Option *local_70;
  allocator<char> local_61 [49];
  HelicsConfigJSON *local_30;
  undefined1 local_22;
  byte local_21;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_21 = in_R8B & 1;
  local_22 = 0;
  local_18 = in_RDX;
  uStack_10 = in_RCX;
  std::make_shared<helics::helicsCLI11App,char_const(&)[94]>(in_stack_ffffffffffffe9b8);
  if ((local_21 & 1) != 0) {
    CLI::std::__shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>::get
              ((__shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2> *)in_RDI);
    local_30 = addJsonConfig(in_stack_ffffffffffffeb80);
    CLI::ConfigBase::maxLayers(&local_30->super_ConfigBase,'\0');
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
    HelicsConfigJSON::promoteSection
              ((HelicsConfigJSON *)in_stack_ffffffffffffe990,(string *)in_stack_ffffffffffffe988);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffe990);
    std::allocator<char>::~allocator(local_61);
  }
  peVar1 = CLI::std::
           __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x4d075d);
  pOVar2 = CLI::App::option_defaults(&peVar1->super_App);
  pOVar2 = CLI::OptionDefaults::ignore_underscore(pOVar2,true);
  CLI::OptionDefaults::ignore_case(pOVar2,true);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4d07ac);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  pOVar3 = CLI::App::add_flag<gmlc::networking::InterfaceNetworks,_(CLI::detail::enabler)0>
                     (in_stack_ffffffffffffea70,in_stack_ffffffffffffea68,
                      (InterfaceNetworks *)in_stack_ffffffffffffea60,in_stack_ffffffffffffea58);
  pOVar3 = CLI::Option::disable_flag_override(pOVar3,true);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_b9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_91);
  local_70 = pOVar3;
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4d08cc);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  CLI::App::
  add_option<gmlc::networking::InterfaceNetworks,_gmlc::networking::InterfaceNetworks,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8,
             (InterfaceNetworks *)in_stack_ffffffffffffeaa0,in_stack_ffffffffffffea98);
  local_338 = local_330;
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[6],_const_char_(&)[2],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffe9e0,(char (*) [6])in_stack_ffffffffffffe9d8,
             (char (*) [2])in_stack_ffffffffffffe9d0);
  local_338 = (undefined8 **)local_2f0;
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[2],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffe9e0,(char (*) [5])in_stack_ffffffffffffe9d8,
             (char (*) [2])in_stack_ffffffffffffe9d0);
  local_338 = (undefined8 **)local_2b0;
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[2],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffe9e0,(char (*) [5])in_stack_ffffffffffffe9d8,
             (char (*) [2])in_stack_ffffffffffffe9d0);
  local_338 = (undefined8 **)local_270;
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[9],_const_char_(&)[3],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffe9e0,(char (*) [9])in_stack_ffffffffffffe9d8,
             (char (*) [3])in_stack_ffffffffffffe9d0);
  local_338 = (undefined8 **)local_230;
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[4],_const_char_(&)[3],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffe9e0,(char (*) [4])in_stack_ffffffffffffe9d8,
             (char (*) [3])in_stack_ffffffffffffe9d0);
  local_1f0 = local_330;
  local_1e8 = 5;
  values._M_len = (size_type)in_stack_ffffffffffffe9f0;
  values._M_array = (iterator)in_stack_ffffffffffffe9e8;
  CLI::CheckedTransformer::CheckedTransformer<>
            ((CheckedTransformer *)in_stack_ffffffffffffe9e0,values);
  CLI::Validator::Validator((Validator *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe988);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  CLI::Option::transform
            (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(string *)in_stack_ffffffffffffe9e0
            );
  CLI::Option::excludes
            (in_stack_ffffffffffffea00,
             (Option *)CONCAT17(in_stack_ffffffffffffe9ff,in_stack_ffffffffffffe9f8));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_359);
  CLI::Validator::~Validator((Validator *)in_stack_ffffffffffffe990);
  CLI::CheckedTransformer::~CheckedTransformer((CheckedTransformer *)0x4d0b2d);
  local_11e8 = (undefined1 ***)&local_1f0;
  do {
    local_11e8 = local_11e8 + -8;
    CLI::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_ffffffffffffe990);
  } while (local_11e8 != local_330);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_109);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_e1);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4d0bc2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  local_3b8 = local_18;
  uStack_3b0 = uStack_10;
  std::function<void(std::__cxx11::string_const&)>::
  function<helics::NetworkBrokerData::commandLineParser(std::basic_string_view<char,std::char_traits<char>>,bool)::__0,void>
            (in_stack_ffffffffffffe9a0,in_stack_ffffffffffffe998);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  CLI::App::add_option_function<std::__cxx11::string>
            (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeab8,
             (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  CLI::Option::envname(in_stack_ffffffffffffe990,(string *)in_stack_ffffffffffffe988);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_409);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_3e1);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x4d0d21);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_381);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4d0d48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffea70,in_stack_ffffffffffffea68,(bool *)in_stack_ffffffffffffea60,
             in_stack_ffffffffffffea58);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_459);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_431);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4d0e34);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffea70,in_stack_ffffffffffffea68,(bool *)in_stack_ffffffffffffea60,
             in_stack_ffffffffffffea58);
  CLI::Option::ignore_underscore<CLI::App>
            (in_stack_ffffffffffffea00,(bool)in_stack_ffffffffffffe9ff);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_4a9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_481);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4d0f3c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffea70,in_stack_ffffffffffffea68,(bool *)in_stack_ffffffffffffea60,
             in_stack_ffffffffffffea58);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_4f9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_4d1);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4d1028);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  local_558 = local_18;
  uStack_550 = uStack_10;
  std::function<void(std::__cxx11::string_const&)>::
  function<helics::NetworkBrokerData::commandLineParser(std::basic_string_view<char,std::char_traits<char>>,bool)::__1,void>
            (in_stack_ffffffffffffe9a0,in_stack_ffffffffffffe998);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  CLI::App::add_option_function<std::__cxx11::string>
            (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeab8,
             (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_581);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x4d111b);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_521);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4d1142);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8,in_stack_ffffffffffffeaa0,
             in_stack_ffffffffffffea98);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_5d1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_5a9);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4d1228);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8,(int *)in_stack_ffffffffffffeaa0,
             in_stack_ffffffffffffea98);
  CLI::Option::capture_default_str(in_stack_ffffffffffffe9b0);
  CLI::Validator::Validator((Validator *)in_stack_ffffffffffffe9b0,in_stack_ffffffffffffe9a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  CLI::Option::check(in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,
                     (string *)in_stack_ffffffffffffe9e0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_6b1);
  CLI::Validator::~Validator((Validator *)in_stack_ffffffffffffe990);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_621);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_5f9);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4d13c2);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8,(int *)in_stack_ffffffffffffeaa0,
             in_stack_ffffffffffffea98);
  CLI::Option::capture_default_str(in_stack_ffffffffffffe9b0);
  CLI::Validator::Validator((Validator *)in_stack_ffffffffffffe9b0,in_stack_ffffffffffffe9a8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  CLI::Option::check(in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,
                     (string *)in_stack_ffffffffffffe9e0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_791);
  CLI::Validator::~Validator((Validator *)in_stack_ffffffffffffe990);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_701);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_6d9);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4d155c);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8,(int *)in_stack_ffffffffffffeaa0,
             in_stack_ffffffffffffea98);
  CLI::Option::capture_default_str(in_stack_ffffffffffffe9b0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_7e1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_7b9);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4d165f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffea70,in_stack_ffffffffffffea68,(bool *)in_stack_ffffffffffffea60,
             in_stack_ffffffffffffea58);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_831);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_809);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4d174b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffea70,in_stack_ffffffffffffea68,(bool *)in_stack_ffffffffffffea60,
             in_stack_ffffffffffffea58);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_881);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_859);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4d1837);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8,in_stack_ffffffffffffeaa0,
             in_stack_ffffffffffffea98);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_8d1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_8a9);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4d1921);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8,in_stack_ffffffffffffeaa0,
             in_stack_ffffffffffffea98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  CLI::Option::envname(in_stack_ffffffffffffe990,(string *)in_stack_ffffffffffffe988);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_949);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_921);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_8f9);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4d1a77);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  std::function<void(long)>::
  function<helics::NetworkBrokerData::commandLineParser(std::basic_string_view<char,std::char_traits<char>>,bool)::__2,void>
            ((function<void_(long)> *)in_stack_ffffffffffffe9a0,
             (anon_class_8_1_8991fb9c *)in_stack_ffffffffffffe998);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  pOVar3 = CLI::App::add_flag_function
                     (in_stack_ffffffffffffea90,in_stack_ffffffffffffea88,in_stack_ffffffffffffea80,
                      in_stack_ffffffffffffea78);
  CLI::Option::disable_flag_override(pOVar3,true);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_9c1);
  CLI::std::function<void_(long)>::~function((function<void_(long)> *)0x4d1b74);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_971);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4d1b9b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  std::function<void(std::__cxx11::string_const&)>::
  function<helics::NetworkBrokerData::commandLineParser(std::basic_string_view<char,std::char_traits<char>>,bool)::__3,void>
            (in_stack_ffffffffffffe9a0,(anon_class_8_1_8991fb9c *)in_stack_ffffffffffffe998);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  CLI::App::add_option_function<std::__cxx11::string>
            (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeab8,
             (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_a39);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)0x4d1c7c);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_9e9);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4d1ca3);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8,(int *)in_stack_ffffffffffffeaa0,
             in_stack_ffffffffffffea98);
  local_bb8 = local_bb0;
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[3],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffe9e0,(char (*) [5])in_stack_ffffffffffffe9d8,
             (char (*) [3])in_stack_ffffffffffffe9d0);
  local_b70 = local_bb0;
  local_b68 = 1;
  values_00._M_len = (size_type)in_stack_ffffffffffffe9f0;
  values_00._M_array = (iterator)in_stack_ffffffffffffe9e8;
  CLI::Transformer::Transformer<std::__cxx11::string(&)(std::__cxx11::string)>
            ((Transformer *)in_stack_ffffffffffffe9e0,values_00,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              *)in_stack_ffffffffffffe9d8);
  CLI::Validator::Validator((Validator *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe988);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  CLI::Option::transform
            (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(string *)in_stack_ffffffffffffe9e0
            );
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_bd9);
  CLI::Validator::~Validator((Validator *)in_stack_ffffffffffffe990);
  CLI::Transformer::~Transformer((Transformer *)0x4d1e58);
  local_1458 = (undefined1 ***)&local_b70;
  do {
    local_1458 = local_1458 + -8;
    CLI::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_ffffffffffffe990);
  } while (local_1458 != local_bb0);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_a89);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_a61);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4d1eeb);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8,(int *)in_stack_ffffffffffffeaa0,
             in_stack_ffffffffffffea98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  CLI::Option::envname(in_stack_ffffffffffffe990,(string *)in_stack_ffffffffffffe988);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_c51);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_c29);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_c01);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4d2043);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8,(int *)in_stack_ffffffffffffeaa0,
             in_stack_ffffffffffffea98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  CLI::Option::envname(in_stack_ffffffffffffe990,(string *)in_stack_ffffffffffffe988);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_cc9);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_ca1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_c79);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4d219b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8,in_stack_ffffffffffffeaa0,
             in_stack_ffffffffffffea98);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  CLI::Option::envname(in_stack_ffffffffffffe990,(string *)in_stack_ffffffffffffe988);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_d41);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_d19);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_cf1);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4d22f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  std::function<void(int_const&)>::
  function<helics::NetworkBrokerData::commandLineParser(std::basic_string_view<char,std::char_traits<char>>,bool)::__4,void>
            ((function<void_(const_int_&)> *)in_stack_ffffffffffffe9a0,
             (anon_class_8_1_8991fb9c *)in_stack_ffffffffffffe998);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  CLI::App::add_option_function<int>
            (in_stack_ffffffffffffeac0,in_stack_ffffffffffffeab8,
             (function<void_(const_int_&)> *)in_stack_ffffffffffffeab0,in_stack_ffffffffffffeaa8);
  local_f49._33_8_ = local_f20;
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[5],_const_char_(&)[3],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffe9e0,(char (*) [5])in_stack_ffffffffffffe9d8,
             (char (*) [3])in_stack_ffffffffffffe9d0);
  local_f49._33_8_ = local_ee0;
  CLI::std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::pair<const_char_(&)[3],_const_char_(&)[5],_true>
            ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)in_stack_ffffffffffffe9e0,(char (*) [3])in_stack_ffffffffffffe9d8,
             (char (*) [5])in_stack_ffffffffffffe9d0);
  local_ea0[0] = local_f20;
  local_ea0[1] = (undefined8 **)0x2;
  values_01._M_len = (size_type)in_stack_ffffffffffffe9f0;
  values_01._M_array = (iterator)in_stack_ffffffffffffe9e8;
  CLI::Transformer::Transformer<std::__cxx11::string(&)(std::__cxx11::string)>
            ((Transformer *)in_stack_ffffffffffffe9e0,values_01,
             (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
              *)in_stack_ffffffffffffe9d8);
  CLI::Validator::Validator((Validator *)in_stack_ffffffffffffe990,in_stack_ffffffffffffe988);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  CLI::Option::transform
            (in_stack_ffffffffffffe9f0,in_stack_ffffffffffffe9e8,(string *)in_stack_ffffffffffffe9e0
            );
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  CLI::Option::envname(in_stack_ffffffffffffe990,(string *)in_stack_ffffffffffffe988);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator((allocator<char> *)(local_f99 + 0x28));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_f49);
  CLI::Validator::~Validator((Validator *)in_stack_ffffffffffffe990);
  CLI::Transformer::~Transformer((Transformer *)0x4d2546);
  pppuVar5 = (undefined8 ***)local_f20;
  local_1538 = (undefined1 ***)local_ea0;
  do {
    local_1538 = local_1538 + -8;
    CLI::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)in_stack_ffffffffffffe990);
  } while ((undefined8 ***)local_1538 != pppuVar5);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_db9);
  CLI::std::function<void_(const_int_&)>::~function((function<void_(const_int_&)> *)0x4d25c1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_d69);
  peVar1 = CLI::std::
           __shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x4d25e8);
  this_01 = (App *)local_f99;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  option_description = (string *)(in_RSI + 0xac);
  variable = &local_fc1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  CLI::App::add_option<int,_int,_(CLI::detail::enabler)0>
            (this_01,(string *)peVar1,(int *)variable,option_description);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator((allocator<char> *)&local_fc1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator((allocator<char> *)local_f99);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4d26d4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  flag_name = (string *)
              CLI::App::add_option_group<CLI::Option_group>
                        (in_stack_ffffffffffffea60,in_stack_ffffffffffffea58,
                         in_stack_ffffffffffffea50);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator((allocator<char> *)(local_1041 + 0x28));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_ff1);
  this_00 = (App *)local_1041;
  local_ff1._33_8_ = flag_name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  flag_description = (string *)(in_RSI + 0xc5);
  flag_result = local_1069;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  CLI::App::add_flag<bool,_(CLI::detail::enabler)0>
            (this_00,flag_name,(bool *)flag_result,flag_description);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  CLI::Option::envname(in_stack_ffffffffffffe990,(string *)in_stack_ffffffffffffe988);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_1091);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_1069);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator((allocator<char> *)local_1041);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  CLI::App::
  add_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
            (this_01,(string *)peVar1,variable,option_description);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe9d0,in_stack_ffffffffffffe9c8,in_stack_ffffffffffffe9c0);
  CLI::Option::envname(in_stack_ffffffffffffe990,(string *)in_stack_ffffffffffffe988);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_1109);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_10e1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffe990);
  std::allocator<char>::~allocator(local_10b9);
  CLI::std::__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4d2a60);
  std::function<void()>::
  function<helics::NetworkBrokerData::commandLineParser(std::basic_string_view<char,std::char_traits<char>>,bool)::__5,void>
            ((function<void_()> *)in_stack_ffffffffffffe9a0,
             (anon_class_8_1_8991fb9c *)in_stack_ffffffffffffe998);
  helicsCLI11App::add_callback(in_stack_ffffffffffffe9e0,in_stack_ffffffffffffe9d8);
  CLI::std::function<void_()>::~function((function<void_()> *)0x4d2abc);
  sVar4.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (shared_ptr<helics::helicsCLI11App>)
         sVar4.super___shared_ptr<helics::helicsCLI11App,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<helicsCLI11App> NetworkBrokerData::commandLineParser(std::string_view localAddress,
                                                                     bool enableConfig)
{
    auto nbparser = std::make_shared<helicsCLI11App>(
        "Network connection information \n(arguments allow '_' characters in the names and ignore them)");
    if (enableConfig) {
        auto* fmtr = addJsonConfig(nbparser.get());
        fmtr->maxLayers(0);
        fmtr->promoteSection("helics");
    }
    nbparser->option_defaults()->ignore_underscore()->ignore_case();

    auto* interfaceFlag = nbparser
                              ->add_flag("--local{0},--ipv4{4},--ipv6{6},--all{10},--external{10}",
                                         interfaceNetwork,
                                         "specify external interface to use, default is --local")
                              ->disable_flag_override();
    nbparser
        ->add_option("--network_connectivity",
                     interfaceNetwork,
                     "specify the connectivity of the network interface")
        ->transform(CLI::CheckedTransformer(
            {{"local", "0"}, {"ipv4", "4"}, {"ipv6", "6"}, {"external", "10"}, {"all", "10"}}))
        ->excludes(interfaceFlag);
    nbparser
        ->add_option_function<std::string>(
            "--broker_address",
            [this, localAddress](const std::string& addr) {
                auto brkprt = gmlc::networking::extractInterfaceAndPort(addr);
                brokerAddress = brkprt.first;
                brokerPort = brkprt.second;
                checkAndUpdateBrokerAddress(localAddress);
            },
            "location of the broker i.e. network address")
        ->envname("HELICS_BROKER_ADDRESS");
    nbparser->add_flag("--reuse_address",
                       reuse_address,
                       "allow the server to reuse a bound address, mostly useful for tcp cores");
    nbparser
        ->add_flag(
            "--noackconnect",
            noAckConnection,
            "specify that a connection_ack message is not required to be connected with a broker")
        ->ignore_underscore();

    nbparser->add_flag(
        "--force",
        forceConnection,
        "if set to true the broker will on an unsuccessful connection as root broker attempt to terminate any existing brokers and reconnect");
    nbparser->add_option_function<std::string>(
        "--broker",
        [this, localAddress](std::string addr) {
            auto brkr = BrokerFactory::findBroker(addr);
            if (brkr) {
                addr = brkr->getAddress();
            }
            if (brokerAddress.empty()) {
                auto brkprt = gmlc::networking::extractInterfaceAndPort(addr);
                brokerAddress = brkprt.first;
                brokerPort = brkprt.second;
                checkAndUpdateBrokerAddress(localAddress);
            } else {
                brokerName = addr;
            }
        },
        "identifier for the broker, this is either the name or network address use --broker_address or --brokername "
        "to explicitly set the network address or name the search for the broker is first by name");

    nbparser->add_option("--brokername", brokerName, "the name of the broker");
    nbparser->add_option("--maxsize", maxMessageSize, "The message buffer size")
        ->capture_default_str()
        ->check(CLI::PositiveNumber);
    nbparser
        ->add_option("--maxcount",
                     maxMessageCount,
                     "The maximum number of message to have in a queue")
        ->capture_default_str()
        ->check(CLI::PositiveNumber);
    nbparser->add_option("--networkretries", maxRetries, "the maximum number of network retries")
        ->capture_default_str();
    nbparser->add_flag("--useosport",
                       use_os_port,
                       "specify that the ports should be allocated by the host operating system");
    nbparser->add_flag("--autobroker",
                       autobroker,
                       "allow a broker to be automatically created if one is not available");
    nbparser->add_option("--brokerinitstring",
                         brokerInitString,
                         "the initialization string for the broker");
    nbparser
        ->add_option("--brokerinit", brokerInitString, "the initialization string for the broker")
        ->envname("HELICS_BROKER_INIT");
    nbparser
        ->add_flag_function(
            "--client{0},--server{1}",
            [this](int64_t val) {
                switch (server_mode) {
                    case ServerModeOptions::UNSPECIFIED:
                    case ServerModeOptions::SERVER_DEFAULT_ACTIVE:
                    case ServerModeOptions::SERVER_DEFAULT_DEACTIVATED:
                        server_mode = (val > 0) ? ServerModeOptions::SERVER_ACTIVE :
                                                  ServerModeOptions::SERVER_DEACTIVATED;
                        break;
                    default:
                        break;
                }
            },
            "specify that the network connection should be a server or client")
        ->disable_flag_override();
    nbparser->add_option_function<std::string>(
        "--local_interface",
        [this](const std::string& addr) {
            auto localprt = gmlc::networking::extractInterfaceAndPort(addr);
            localInterface = localprt.first;
            // this may get overridden later
            portNumber = localprt.second;
        },
        "the local interface to use for the receive ports");
    nbparser->add_option("--port,-p", portNumber, "port number to use")
        ->transform(CLI::Transformer({{"auto", "-1"}}, CLI::ignore_case));
    nbparser
        ->add_option("--brokerport",
                     brokerPort,
                     "the port number to use to connect with the broker")
        ->envname("HELICS_BROKER_PORT");

    nbparser
        ->add_option("--connectionport",
                     connectionPort,
                     "the port number to use to connect a co-simulation")
        ->envname("HELICS_CONNECTION_PORT");
    nbparser
        ->add_option("--connectionaddress",
                     connectionAddress,
                     "the network address to use to connect a co-simulation")
        ->envname("HELICS_CONNECTION_ADDRESS");
    nbparser
        ->add_option_function<int>(
            "--localport",
            [this](int port) {
                if (port == -999) {
                    use_os_port = true;
                } else {
                    portNumber = port;
                }
            },
            "port number for the local receive port")
        ->transform(CLI::Transformer({{"auto", "-1"}, {"os", "-999"}}, CLI::ignore_case))
        ->envname("HELICS_LOCAL_PORT");
    nbparser->add_option("--portstart", portStart, "starting port for automatic port definitions");

    auto* encrypt_group = nbparser->add_option_group("encryption", "options related to encryption");
    encrypt_group->add_flag("--encrypted", encrypted, "enable encryption on the network")
        ->envname("HELICS_ENCRYPTION");
    encrypt_group
        ->add_option("--encryption_config",
                     encryptionConfig,
                     "set the configuration file for encryption options")
        ->envname("HELICS_ENCRYPTION_CONFIG");

    nbparser->add_callback([this]() {
        if ((!brokerAddress.empty()) && (brokerPort == -1)) {
            if ((localInterface.empty()) && (portNumber != -1)) {
                std::swap(brokerPort, portNumber);
            }
        }
    });

    return nbparser;
}